

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

void __thiscall rw::PluginList::streamSkip(PluginList *this,Stream *stream)

{
  bool bVar1;
  undefined1 local_2c [8];
  ChunkHeaderInfo header;
  int32 length;
  Stream *stream_local;
  PluginList *this_local;
  
  unique0x10000086 = stream;
  bVar1 = findChunk(stream,3,&header.version,(uint32 *)0x0);
  if (bVar1) {
    while ((0 < (int)header.version &&
           (bVar1 = readChunkHeaderInfo(stack0xffffffffffffffe8,(ChunkHeaderInfo *)local_2c), bVar1)
           )) {
      (*stack0xffffffffffffffe8->_vptr_Stream[5])
                (stack0xffffffffffffffe8,(ulong)(uint)local_2c._4_4_,1);
      header.version = header.version - (local_2c._4_4_ + 0xc);
    }
  }
  return;
}

Assistant:

void
PluginList::streamSkip(Stream *stream)
{
	int32 length;
	ChunkHeaderInfo header;
	if(!findChunk(stream, ID_EXTENSION, (uint32*)&length, nil))
		return;
	while(length > 0){
		if(!readChunkHeaderInfo(stream, &header))
			return;
		stream->seek(header.length);
		length -= 12 + header.length;
	}
}